

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRep * absl::cord_internal::anon_unknown_0::ResizeEdge
                    (CordRep *edge,size_t length,bool is_mutable)

{
  bool bVar1;
  CordRepSubstring *pCVar2;
  
  if (length == 0) {
    __assert_fail("length > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x99,
                  "CordRep *absl::cord_internal::(anonymous namespace)::ResizeEdge(CordRep *, size_t, bool)"
                 );
  }
  if (length <= edge->length) {
    bVar1 = IsDataEdge(edge);
    if (!bVar1) {
      __assert_fail("IsDataEdge(edge)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x9b,
                    "CordRep *absl::cord_internal::(anonymous namespace)::ResizeEdge(CordRep *, size_t, bool)"
                   );
    }
    if (length < edge->length) {
      if ((!is_mutable) || (edge->tag < 6 && edge->tag != 1)) {
        pCVar2 = CreateSubstring(edge,0,length);
        return &pCVar2->super_CordRep;
      }
      edge->length = length;
    }
    return edge;
  }
  __assert_fail("length <= edge->length",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                ,0x9a,
                "CordRep *absl::cord_internal::(anonymous namespace)::ResizeEdge(CordRep *, size_t, bool)"
               );
}

Assistant:

CordRep* ResizeEdge(CordRep* edge, size_t length, bool is_mutable) {
  assert(length > 0);
  assert(length <= edge->length);
  assert(IsDataEdge(edge));
  if (length >= edge->length) return edge;

  if (is_mutable && (edge->tag >= FLAT || edge->tag == SUBSTRING)) {
    edge->length = length;
    return edge;
  }

  return CreateSubstring(edge, 0, length);
}